

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sshproxy.c
# Opt level: O0

SeatPromptResult *
sshproxy_get_userpass_input(SeatPromptResult *__return_storage_ptr__,Seat *seat,prompts_t *p)

{
  InteractionReadySeat iseat;
  SshProxy *sp;
  prompts_t *p_local;
  Seat *seat_local;
  
  if ((((((ulong)seat[-0x40f].vt & 1) == 0) || (((ulong)seat[-0x40f].vt & 0x100) != 0)) ||
      (p->n_prompts != 1)) || (((*p->prompts)->echo & 1U) != 0)) {
    if (seat[-0x411].vt == (SeatVtable *)0x0) {
      sshproxy_error((SshProxy *)(seat + -0x416),
                     "Unable to provide interactive authentication requested by proxy SSH connection"
                    );
      make_spr_sw_abort_static
                (__return_storage_ptr__,
                 "Noninteractive SSH proxy cannot perform interactive authentication");
    }
    else {
      iseat = wrap((Seat *)seat[-0x411].vt);
      seat_get_userpass_input(__return_storage_ptr__,iseat,p);
    }
  }
  else {
    prompt_set_result(*p->prompts,(char *)seat[-0x40e].vt);
    burnstr((char *)seat[-0x40e].vt);
    seat[-0x40e].vt = (SeatVtable *)0x0;
    *(undefined1 *)((long)&seat[-0x40f].vt + 1) = 1;
    make_spr_simple(__return_storage_ptr__,SPRK_OK);
  }
  return __return_storage_ptr__;
}

Assistant:

static SeatPromptResult sshproxy_get_userpass_input(Seat *seat, prompts_t *p)
{
    SshProxy *sp = container_of(seat, SshProxy, seat);

    /*
     * If we have a stored proxy_password, use that, via logic similar
     * to cmdline_get_passwd_input: we only try it if we're given a
     * prompts_t containing exactly one prompt, and that prompt is set
     * to non-echoing.
     */
    if (sp->got_proxy_password && !sp->tried_proxy_password &&
        p->n_prompts == 1 && !p->prompts[0]->echo) {
        prompt_set_result(p->prompts[0], sp->proxy_password);
        burnstr(sp->proxy_password);
        sp->proxy_password = NULL;
        sp->tried_proxy_password = true;
        return SPR_OK;
    }

    if (sp->clientseat) {
        /*
         * If we have access to the outer Seat, pass this prompt
         * request on to it.
         */
        return seat_get_userpass_input(wrap(sp->clientseat), p);
    }

    /*
     * Otherwise, behave as if noninteractive (like plink -batch):
     * reject all attempts to present a prompt to the user, and log in
     * the Event Log to say why not.
     */
    sshproxy_error(sp, "Unable to provide interactive authentication "
                   "requested by proxy SSH connection");
    return SPR_SW_ABORT("Noninteractive SSH proxy cannot perform "
                        "interactive authentication");
}